

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinputsimulatorimpllinux.cpp
# Opt level: O0

void __thiscall XInputSimulatorImplLinux::initMouseEvent(XInputSimulatorImplLinux *this,int button)

{
  int button_local;
  XInputSimulatorImplLinux *this_local;
  
  (this->event).xcrossing.detail = button;
  (this->event).xkey.same_screen = 1;
  (this->event).xkey.subwindow =
       *(Window *)
        (*(long *)(this->display + 0xe8) + (long)*(int *)(this->display + 0xe0) * 0x80 + 0x10);
  while ((this->event).xkey.subwindow != 0) {
    (this->event).xany.window = (this->event).xkey.subwindow;
    XQueryPointer(this->display,(this->event).xany.window,(undefined1 *)((long)&this->event + 0x28),
                  (undefined1 *)((long)&this->event + 0x30),
                  (undefined1 *)((long)&this->event + 0x48),
                  (undefined1 *)((long)&this->event + 0x4c),
                  (undefined1 *)((long)&this->event + 0x40),
                  (undefined1 *)((long)&this->event + 0x44),
                  (undefined1 *)((long)&this->event + 0x50));
  }
  return;
}

Assistant:

void XInputSimulatorImplLinux::initMouseEvent(int button)
{
    event.xbutton.button = button; //which button
    event.xbutton.same_screen = True;
    event.xbutton.subwindow = DefaultRootWindow(display);
    while (event.xbutton.subwindow)
    {
        event.xbutton.window = event.xbutton.subwindow;
        XQueryPointer(display, event.xbutton.window,
                      &event.xbutton.root, &event.xbutton.subwindow,
                      &event.xbutton.x_root, &event.xbutton.y_root,
                      &event.xbutton.x, &event.xbutton.y,
                      &event.xbutton.state);
    }
}